

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::Hashing::compute_hash_graphics_pipeline
               (StateRecorder *recorder,VkGraphicsPipelineCreateInfo *create_info,Hash *out_hash)

{
  int iVar1;
  VkPipelineDynamicStateCreateInfo *pVVar2;
  VkPipelineDepthStencilStateCreateInfo *pVVar3;
  VkPipelineInputAssemblyStateCreateInfo *pVVar4;
  VkPipelineRasterizationStateCreateInfo *pVVar5;
  VkPipelineMultisampleStateCreateInfo *pVVar6;
  VkPipelineViewportStateCreateInfo *pVVar7;
  VkRect2D *pVVar8;
  VkViewport *pVVar9;
  VkPipelineVertexInputStateCreateInfo *pVVar10;
  VkVertexInputAttributeDescription *pVVar11;
  VkVertexInputBindingDescription *pVVar12;
  VkPipelineColorBlendStateCreateInfo *pVVar13;
  VkPipelineColorBlendAttachmentState *pVVar14;
  VkPipelineTessellationStateCreateInfo *pVVar15;
  bool bVar16;
  VkGraphicsPipelineLibraryFlagsEXT state_flags;
  VkPipelineCreateFlags2CreateInfo *pVVar17;
  ulong uVar18;
  ulong uVar19;
  undefined8 extraout_RDX;
  ulong uVar20;
  VkGraphicsPipelineCreateInfo *pNext;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  byte bVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  uint32_t i_1;
  GlobalStateInfo GVar28;
  Hasher local_f0;
  byte local_e3;
  undefined1 local_e2;
  undefined1 local_e1;
  ulong local_e0;
  DynamicStateInfo dynamic_info;
  Hash hash;
  VkGraphicsPipelineLibraryFlagsEXT local_88;
  uint local_84;
  StateRecorder *local_80;
  Hash *local_78;
  SubpassMeta meta;
  undefined6 uStack_6e;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  pNext = create_info;
  state_flags = graphics_pipeline_get_effective_state_flags((Fossilize *)create_info,create_info);
  pVVar17 = find_pnext<VkPipelineCreateFlags2CreateInfo>((VkStructureType)create_info->pNext,pNext);
  local_f0.h = (ulong)(create_info->flags & 0x7ffffc3f) ^ 0xaf63bd4c8601b7df;
  if (pVVar17 != (VkPipelineCreateFlags2CreateInfo *)0x0) {
    local_f0.h = 0xaf63bd4c8601b7df;
  }
  if (((create_info->flags & 4) != 0) && (create_info->basePipelineHandle != (VkPipeline)0x0)) {
    bVar16 = StateRecorder::get_hash_for_graphics_pipeline_handle
                       (recorder,create_info->basePipelineHandle,&hash);
    if (!bVar16) {
      return false;
    }
    local_f0.h = ((hash & 0xffffffff ^ local_f0.h * 0x100000001b3) * 0x100000001b3 ^ hash >> 0x20) *
                 0x100000001b3 ^ (ulong)(uint)create_info->basePipelineIndex;
  }
  dynamic_info.color_blend_advanced = false;
  dynamic_info.provoking_vertex_mode = false;
  dynamic_info.line_rasterization_mode = false;
  dynamic_info.line_stipple_enable = false;
  dynamic_info.depth_clip_negative_one_to_one = false;
  dynamic_info.viewport_w_scaling_enable = false;
  dynamic_info.viewport_swizzle = false;
  dynamic_info.coverage_to_color_enable = false;
  dynamic_info.coverage_to_color_location = false;
  dynamic_info.coverage_modulation_mode = false;
  dynamic_info.coverage_modulation_table_enable = false;
  dynamic_info.coverage_modulation_table = false;
  dynamic_info.shading_rate_image_enable = false;
  dynamic_info.representative_fragment_test_enable = false;
  dynamic_info.coverage_reduction_mode = false;
  dynamic_info.depth_clamp_range = false;
  dynamic_info.tessellation_domain_origin = false;
  dynamic_info.depth_clamp_enable = false;
  dynamic_info.polygon_mode = false;
  dynamic_info.rasterization_samples = false;
  dynamic_info.sample_mask = false;
  dynamic_info.alpha_to_coverage_enable = false;
  dynamic_info.alpha_to_one_enable = false;
  dynamic_info.logic_op_enable = false;
  dynamic_info.color_blend_enable = false;
  dynamic_info.color_blend_equation = false;
  dynamic_info.color_write_mask = false;
  dynamic_info.rasterization_stream = false;
  dynamic_info.conservative_rasterization_mode = false;
  dynamic_info.extra_primitive_overestimation_size = false;
  dynamic_info.depth_clip_enable = false;
  dynamic_info.sample_locations_enable = false;
  dynamic_info.depth_bounds_test_enable = false;
  dynamic_info.stencil_test_enable = false;
  dynamic_info.stencil_op = false;
  dynamic_info.vertex_input = false;
  dynamic_info.vertex_input_binding_stride = false;
  dynamic_info.patch_control_points = false;
  dynamic_info.rasterizer_discard_enable = false;
  dynamic_info.primitive_restart_enable = false;
  dynamic_info.logic_op = false;
  dynamic_info.color_write_enable = false;
  dynamic_info.depth_bias_enable = false;
  dynamic_info.discard_rectangle = false;
  dynamic_info.discard_rectangle_mode = false;
  dynamic_info.fragment_shading_rate = false;
  dynamic_info.sample_locations = false;
  dynamic_info.line_stipple = false;
  dynamic_info.stencil_compare = false;
  dynamic_info.stencil_reference = false;
  dynamic_info.stencil_write_mask = false;
  dynamic_info.depth_bounds = false;
  dynamic_info.depth_bias = false;
  dynamic_info.line_width = false;
  dynamic_info.blend_constants = false;
  dynamic_info.scissor = false;
  dynamic_info.viewport = false;
  dynamic_info.scissor_count = false;
  dynamic_info.viewport_count = false;
  dynamic_info.cull_mode = false;
  dynamic_info.front_face = false;
  dynamic_info.depth_test_enable = false;
  dynamic_info.depth_write_enable = false;
  dynamic_info.depth_compare_op = false;
  if (create_info->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    parse_dynamic_state_info((DynamicStateInfo *)&meta,create_info->pDynamicState);
    dynamic_info._2_6_ = uStack_6e;
    dynamic_info._0_2_ = meta;
    dynamic_info._48_8_ = local_40;
    dynamic_info._56_8_ = uStack_38;
    dynamic_info._32_8_ = local_50;
    dynamic_info._40_8_ = uStack_48;
    dynamic_info._16_8_ = local_60;
    dynamic_info._24_8_ = uStack_58;
    dynamic_info._8_8_ = uStack_68;
  }
  meta.uses_color = true;
  meta.uses_depth_stencil = true;
  GVar28 = parse_global_state_info(create_info,&dynamic_info,&meta);
  if ((GVar28._8_3_ >> 8 & 1) == 0) {
    hash = 0;
  }
  else {
    bVar16 = StateRecorder::get_hash_for_pipeline_layout(recorder,create_info->layout,&hash);
    if (!bVar16) {
      return false;
    }
  }
  local_f0.h = (hash & 0xffffffff ^ local_f0.h * 0x100000001b3) * 0x100000001b3 ^ hash >> 0x20;
  hash = 0;
  if ((((undefined1  [11])GVar28 & (undefined1  [11])0x1) == (undefined1  [11])0x0) ||
     (bVar16 = StateRecorder::get_hash_for_render_pass(recorder,create_info->renderPass,&hash),
     bVar16)) {
    local_f0.h = (hash & 0xffffffff ^ local_f0.h * 0x100000001b3) * 0x100000001b3 ^ hash >> 0x20;
    meta.uses_color = false;
    meta.uses_depth_stencil = false;
    bVar16 = StateRecorder::get_subpass_meta_for_pipeline(recorder,create_info,hash,&meta);
    if (bVar16) {
      GVar28 = parse_global_state_info(create_info,&dynamic_info,&meta);
      local_e0 = GVar28._0_8_;
      uVar27 = (uint)CONCAT53((int5)((ulong)extraout_RDX >> 0x18),GVar28._8_3_);
      uVar21 = (ulong)create_info->subpass;
      if (((undefined1  [11])GVar28 & (undefined1  [11])0x1) == (undefined1  [11])0x0) {
        uVar21 = 0;
      }
      uVar18 = (ulong)create_info->stageCount;
      if ((uVar27 >> 0x10 & 1) == 0) {
        uVar18 = 0;
      }
      uVar18 = uVar18 ^ (uVar21 ^ local_f0.h * 0x100000001b3) * 0x100000001b3;
      pVVar2 = create_info->pDynamicState;
      if (pVVar2 == (VkPipelineDynamicStateCreateInfo *)0x0) {
        local_f0.h = uVar18 * 0x100000001b3;
      }
      else {
        local_f0.h = (uVar18 * 0x100000001b3 ^ (ulong)pVVar2->dynamicStateCount) * 0x100000001b3 ^
                     (ulong)pVVar2->flags;
        for (uVar21 = 0; pVVar2->dynamicStateCount != uVar21; uVar21 = uVar21 + 1) {
          local_f0.h = local_f0.h * 0x100000001b3 ^ (ulong)pVVar2->pDynamicStates[uVar21];
        }
        bVar16 = hash_pnext_chain(recorder,&local_f0,pVVar2->pNext,&dynamic_info,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if ((local_e0 >> 0x20 & 1) == 0) {
        local_f0.h = local_f0.h * 0x100000001b3;
      }
      else {
        pVVar3 = create_info->pDepthStencilState;
        if (dynamic_info.depth_bounds_test_enable == false) {
          uVar21 = (ulong)pVVar3->depthBoundsTestEnable;
        }
        else {
          uVar21 = 0;
        }
        if (dynamic_info.depth_compare_op == false) {
          uVar18 = (ulong)pVVar3->depthCompareOp;
        }
        else {
          uVar18 = 0;
        }
        if (dynamic_info.depth_test_enable == false) {
          uVar22 = (ulong)pVVar3->depthTestEnable;
        }
        else {
          uVar22 = 0;
        }
        if (dynamic_info.depth_write_enable == false) {
          uVar19 = (ulong)pVVar3->depthWriteEnable;
        }
        else {
          uVar19 = 0;
        }
        uVar19 = ((((local_f0.h * 0x100000001b3 ^ (ulong)pVVar3->flags) * 0x100000001b3 ^ uVar21) *
                   0x100000001b3 ^ uVar18) * 0x100000001b3 ^ uVar22) * 0x100000001b3 ^ uVar19;
        if (dynamic_info.stencil_op == true) {
          uVar19 = uVar19 * -0x3aad8475ae2c2d25;
          uVar21 = 0;
        }
        else {
          uVar19 = ((((((uVar19 * 0x100000001b3 ^ (ulong)(pVVar3->front).compareOp) * 0x100000001b3
                       ^ (ulong)(pVVar3->front).depthFailOp) * 0x100000001b3 ^
                      (ulong)(pVVar3->front).failOp) * 0x100000001b3 ^ (ulong)(pVVar3->front).passOp
                     ) * 0x100000001b3 ^ (ulong)(pVVar3->back).compareOp) * 0x100000001b3 ^
                   (ulong)(pVVar3->back).depthFailOp) * 0x100000001b3 ^ (ulong)(pVVar3->back).failOp
          ;
          uVar21 = (ulong)(pVVar3->back).passOp;
        }
        if (dynamic_info.stencil_test_enable == false) {
          uVar18 = (ulong)pVVar3->stencilTestEnable;
        }
        else {
          uVar18 = 0;
        }
        local_f0.h = (uVar19 * 0x100000001b3 ^ uVar21) * 0x100000001b3 ^ uVar18;
        if ((dynamic_info.depth_bounds == false) &&
           ((pVVar3->depthBoundsTestEnable == 0 & (dynamic_info.depth_bounds_test_enable ^ 1U)) == 0
           )) {
          local_f0.h = (local_f0.h * 0x100000001b3 ^ (ulong)(uint)pVVar3->minDepthBounds) *
                       0x100000001b3 ^ (ulong)(uint)pVVar3->maxDepthBounds;
        }
        if ((pVVar3->stencilTestEnable == 0 & (dynamic_info.stencil_test_enable ^ 1U)) == 0) {
          if (dynamic_info.stencil_compare == false) {
            local_f0.h = (local_f0.h * 0x100000001b3 ^ (ulong)(pVVar3->front).compareMask) *
                         0x100000001b3 ^ (ulong)(pVVar3->back).compareMask;
          }
          if (dynamic_info.stencil_reference == false) {
            local_f0.h = (local_f0.h * 0x100000001b3 ^ (ulong)(pVVar3->front).reference) *
                         0x100000001b3 ^ (ulong)(pVVar3->back).reference;
          }
          if (dynamic_info.stencil_write_mask == false) {
            local_f0.h = (local_f0.h * 0x100000001b3 ^ (ulong)(pVVar3->front).writeMask) *
                         0x100000001b3 ^ (ulong)(pVVar3->back).writeMask;
          }
        }
        bVar16 = hash_pnext_chain(recorder,&local_f0,pVVar3->pNext,&dynamic_info,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if ((local_e0 & 1) == 0) {
        local_f0.h = local_f0.h * 0x100000001b3;
      }
      else {
        pVVar4 = create_info->pInputAssemblyState;
        if (dynamic_info.primitive_restart_enable == false) {
          uVar21 = (ulong)pVVar4->primitiveRestartEnable;
        }
        else {
          uVar21 = 0;
        }
        local_f0.h = ((local_f0.h * 0x100000001b3 ^ (ulong)pVVar4->flags) * 0x100000001b3 ^ uVar21)
                     * 0x100000001b3 ^ (ulong)pVVar4->topology;
        bVar16 = hash_pnext_chain(recorder,&local_f0,pVVar4->pNext,&dynamic_info,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if ((local_e0 >> 0x38 & 1) == 0) {
        local_f0.h = local_f0.h * 0x100000001b3;
      }
      else {
        pVVar5 = create_info->pRasterizationState;
        if (dynamic_info.cull_mode == false) {
          uVar21 = (ulong)pVVar5->cullMode;
        }
        else {
          uVar21 = 0;
        }
        if (dynamic_info.depth_clamp_enable == false) {
          uVar18 = (ulong)pVVar5->depthClampEnable;
        }
        else {
          uVar18 = 0;
        }
        if (dynamic_info.front_face == false) {
          uVar22 = (ulong)pVVar5->frontFace;
        }
        else {
          uVar22 = 0;
        }
        if (dynamic_info.rasterizer_discard_enable == false) {
          uVar19 = (ulong)pVVar5->rasterizerDiscardEnable;
        }
        else {
          uVar19 = 0;
        }
        if (dynamic_info.polygon_mode == false) {
          uVar20 = (ulong)pVVar5->polygonMode;
        }
        else {
          uVar20 = 0;
        }
        uVar25 = 0;
        if (dynamic_info.depth_bias_enable == false) {
          uVar25 = (ulong)pVVar5->depthBiasEnable;
        }
        local_f0.h = ((((((local_f0.h * 0x100000001b3 ^ (ulong)pVVar5->flags) * 0x100000001b3 ^
                         uVar21) * 0x100000001b3 ^ uVar18) * 0x100000001b3 ^ uVar22) * 0x100000001b3
                      ^ uVar19) * 0x100000001b3 ^ uVar20) * 0x100000001b3 ^ uVar25;
        if ((((ulong)pVVar5->depthBiasEnable == 0 & (dynamic_info.depth_bias_enable ^ 1U)) == 0) &&
           (dynamic_info.depth_bias == false)) {
          local_f0.h = ((local_f0.h * 0x100000001b3 ^ (ulong)(uint)pVVar5->depthBiasClamp) *
                        0x100000001b3 ^ (ulong)(uint)pVVar5->depthBiasSlopeFactor) * 0x100000001b3 ^
                       (ulong)(uint)pVVar5->depthBiasConstantFactor;
        }
        if (dynamic_info.line_width == false) {
          local_f0.h = local_f0.h * 0x100000001b3 ^ (ulong)(uint)pVVar5->lineWidth;
        }
        bVar16 = hash_pnext_chain(recorder,&local_f0,pVVar5->pNext,&dynamic_info,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if (((uint)local_e0 >> 0x18 & 1) != 0) {
        pVVar6 = create_info->pMultisampleState;
        if (dynamic_info.alpha_to_coverage_enable == false) {
          uVar21 = (ulong)pVVar6->alphaToCoverageEnable;
        }
        else {
          uVar21 = 0;
        }
        if (dynamic_info.alpha_to_one_enable == false) {
          uVar18 = (ulong)pVVar6->alphaToOneEnable;
        }
        else {
          uVar18 = 0;
        }
        if (dynamic_info.rasterization_samples == false) {
          uVar22 = (ulong)pVVar6->rasterizationSamples;
        }
        else {
          uVar22 = 0;
        }
        local_f0.h = (((((local_f0.h * 0x100000001b3 ^ (ulong)pVVar6->flags) * 0x100000001b3 ^
                        uVar21) * 0x100000001b3 ^ uVar18) * 0x100000001b3 ^
                      (ulong)(uint)pVVar6->minSampleShading) * 0x100000001b3 ^ uVar22) *
                     0x100000001b3 ^ (ulong)pVVar6->sampleShadingEnable;
        if ((dynamic_info.sample_mask == false) && (pVVar6->pSampleMask != (VkSampleMask *)0x0)) {
          for (uVar21 = 0;
              ((long)(int)(pVVar6->rasterizationSamples +
                          (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT|
                           VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT)) / 0x20 & 0xffffffffU) !=
              uVar21; uVar21 = uVar21 + 1) {
            local_f0.h = local_f0.h * 0x100000001b3 ^ (ulong)pVVar6->pSampleMask[uVar21];
          }
        }
        else {
          local_f0.h = local_f0.h * 0x100000001b3;
        }
        bVar16 = hash_pnext_chain(recorder,&local_f0,pVVar6->pNext,&dynamic_info,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if (((uint)local_e0 >> 0x10 & 1) == 0) {
        local_f0.h = local_f0.h * 0x100000001b3;
      }
      else {
        pVVar7 = create_info->pViewportState;
        if (dynamic_info.scissor_count == false) {
          uVar21 = (ulong)pVVar7->scissorCount;
        }
        else {
          uVar21 = 0;
        }
        if (dynamic_info.viewport_count == false) {
          uVar18 = (ulong)pVVar7->viewportCount;
        }
        else {
          uVar18 = 0;
        }
        local_f0.h = ((local_f0.h * 0x100000001b3 ^ (ulong)pVVar7->flags) * 0x100000001b3 ^ uVar21)
                     * 0x100000001b3 ^ uVar18;
        if (dynamic_info.scissor == false) {
          for (lVar26 = 0; (ulong)pVVar7->scissorCount << 4 != lVar26; lVar26 = lVar26 + 0x10) {
            pVVar8 = pVVar7->pScissors;
            local_f0.h = (((local_f0.h * 0x100000001b3 ^
                           (ulong)*(uint *)((long)&(pVVar8->offset).x + lVar26)) * 0x100000001b3 ^
                          (ulong)*(uint *)((long)&(pVVar8->offset).y + lVar26)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&(pVVar8->extent).width + lVar26)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&(pVVar8->extent).height + lVar26);
          }
        }
        if (dynamic_info.viewport == false) {
          for (lVar26 = 0; (ulong)pVVar7->viewportCount * 0x18 - lVar26 != 0; lVar26 = lVar26 + 0x18
              ) {
            pVVar9 = pVVar7->pViewports;
            local_f0.h = (((((local_f0.h * 0x100000001b3 ^
                             (ulong)*(uint *)((long)&pVVar9->x + lVar26)) * 0x100000001b3 ^
                            (ulong)*(uint *)((long)&pVVar9->y + lVar26)) * 0x100000001b3 ^
                           (ulong)*(uint *)((long)&pVVar9->width + lVar26)) * 0x100000001b3 ^
                          (ulong)*(uint *)((long)&pVVar9->height + lVar26)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&pVVar9->minDepth + lVar26)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&pVVar9->maxDepth + lVar26);
          }
        }
        bVar16 = hash_pnext_chain(recorder,&local_f0,pVVar7->pNext,&dynamic_info,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if ((local_e0 >> 0x30 & 1) == 0) {
        local_f0.h = local_f0.h * 0x100000001b3;
      }
      else {
        pVVar10 = create_info->pVertexInputState;
        local_f0.h = ((local_f0.h * 0x100000001b3 ^ (ulong)pVVar10->flags) * 0x100000001b3 ^
                     (ulong)pVVar10->vertexAttributeDescriptionCount) * 0x100000001b3 ^
                     (ulong)pVVar10->vertexBindingDescriptionCount;
        for (lVar26 = 0; (ulong)pVVar10->vertexAttributeDescriptionCount << 4 != lVar26;
            lVar26 = lVar26 + 0x10) {
          pVVar11 = pVVar10->pVertexAttributeDescriptions;
          local_f0.h = (((local_f0.h * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&pVVar11->offset + lVar26)) * 0x100000001b3 ^
                        (ulong)*(uint *)((long)&pVVar11->binding + lVar26)) * 0x100000001b3 ^
                       (ulong)*(uint *)((long)&pVVar11->format + lVar26)) * 0x100000001b3 ^
                       (ulong)*(uint *)((long)&pVVar11->location + lVar26);
        }
        for (lVar26 = 0; (ulong)pVVar10->vertexBindingDescriptionCount * 0xc - lVar26 != 0;
            lVar26 = lVar26 + 0xc) {
          pVVar12 = pVVar10->pVertexBindingDescriptions;
          if ((dynamic_info._16_8_ & 0x100000000) == 0) {
            uVar21 = (ulong)*(uint *)((long)&pVVar12->stride + lVar26);
          }
          else {
            uVar21 = 0;
          }
          local_f0.h = ((local_f0.h * 0x100000001b3 ^
                        (ulong)*(uint *)((long)&pVVar12->binding + lVar26)) * 0x100000001b3 ^
                       (ulong)*(uint *)((long)&pVVar12->inputRate + lVar26)) * 0x100000001b3 ^
                       uVar21;
        }
        bVar16 = hash_pnext_chain(recorder,&local_f0,pVVar10->pNext,&dynamic_info,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      local_88 = state_flags;
      if ((local_e0 & 0x10000000000) == 0) {
        local_f0.h = local_f0.h * 0x100000001b3;
      }
      else {
        pVVar13 = create_info->pColorBlendState;
        if (dynamic_info.logic_op_enable == false) {
          uVar21 = (ulong)pVVar13->logicOpEnable;
        }
        else {
          uVar21 = 0;
        }
        if ((dynamic_info.logic_op == false) &&
           ((pVVar13->logicOpEnable == 0 & (dynamic_info.logic_op_enable ^ 1U)) == 0)) {
          uVar18 = (ulong)pVVar13->logicOp;
        }
        else {
          uVar18 = 0;
        }
        local_f0.h = (((local_f0.h * 0x100000001b3 ^ (ulong)pVVar13->flags) * 0x100000001b3 ^
                      (ulong)pVVar13->attachmentCount) * 0x100000001b3 ^ uVar21) * 0x100000001b3 ^
                     uVar18;
        if ((dynamic_info.color_blend_enable == true) && ((dynamic_info._40_8_ & 0x10000) != 0)) {
          bVar24 = 1;
          if (dynamic_info.color_blend_equation == true) {
            local_f0.h = local_f0.h * 0x100000001b3;
            bVar24 = 0;
          }
        }
        else {
          bVar24 = 1;
        }
        local_e2 = dynamic_info.color_blend_advanced;
        lVar26 = 0;
        local_e1 = dynamic_info.color_blend_equation;
        local_e3 = dynamic_info.color_blend_equation;
        for (uVar21 = 0; (bool)(bVar24 & uVar21 < pVVar13->attachmentCount); uVar21 = uVar21 + 1) {
          pVVar14 = pVVar13->pAttachments;
          if (dynamic_info.color_blend_enable == false) {
            uVar18 = (ulong)*(uint *)((long)&pVVar14->blendEnable + lVar26);
          }
          else {
            uVar18 = 0;
          }
          if ((dynamic_info._40_8_ & 0x10000) == 0) {
            uVar22 = (ulong)*(uint *)((long)&pVVar14->colorWriteMask + lVar26);
          }
          else {
            uVar22 = 0;
          }
          uVar22 = (local_f0.h * 0x100000001b3 ^ uVar18) * 0x100000001b3 ^ uVar22;
          if ((*(int *)((long)&pVVar14->blendEnable + lVar26) == 0 &
              (dynamic_info.color_blend_enable ^ 1U)) == 0) {
            if (dynamic_info.color_blend_equation == false) {
              if ((dynamic_info._48_8_ & 1) == 0) {
                uVar18 = (ulong)*(uint *)((long)&pVVar14->colorBlendOp + lVar26);
                uVar22 = uVar22 * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&pVVar14->alphaBlendOp + lVar26);
              }
              else {
                uVar22 = uVar22 * 0x100000001b3;
                uVar18 = 0;
              }
              uVar23 = *(uint *)((long)&pVVar14->dstAlphaBlendFactor + lVar26);
              local_f0.h = ((((uVar22 * 0x100000001b3 ^ uVar18) * 0x100000001b3 ^ (ulong)uVar23) *
                             0x100000001b3 ^
                            (ulong)*(uint *)((long)&pVVar14->srcAlphaBlendFactor + lVar26)) *
                            0x100000001b3 ^
                           (ulong)*(uint *)((long)&pVVar14->dstColorBlendFactor + lVar26)) *
                           0x100000001b3 ^
                           (ulong)*(uint *)((long)&pVVar14->srcColorBlendFactor + lVar26);
            }
            else {
              local_f0.h = uVar22 * 0x100000001b3;
              uVar23 = *(uint *)((long)&pVVar14->dstAlphaBlendFactor + lVar26);
            }
            if (((((uVar23 == 10) || (uVar23 == 0xc)) ||
                 (iVar1 = *(int *)((long)&pVVar14->srcAlphaBlendFactor + lVar26), iVar1 == 10)) ||
                ((iVar1 == 0xc ||
                 (iVar1 = *(int *)((long)&pVVar14->dstColorBlendFactor + lVar26), iVar1 == 10)))) ||
               ((iVar1 == 0xc ||
                ((iVar1 = *(int *)((long)&pVVar14->srcColorBlendFactor + lVar26), iVar1 == 0xc ||
                 (iVar1 == 10)))))) {
              local_e3 = 1;
            }
          }
          else {
            local_f0.h = uVar22 * 0x100000001b3;
          }
          lVar26 = lVar26 + 0x20;
        }
        if (((local_e3 & 1) != 0) && (dynamic_info.blend_constants == false)) {
          for (lVar26 = 0; lVar26 != 0x10; lVar26 = lVar26 + 4) {
            local_f0.h = local_f0.h * 0x100000001b3 ^
                         (ulong)*(uint *)((long)pVVar13->blendConstants + lVar26);
          }
        }
        local_84 = uVar27;
        local_80 = recorder;
        local_78 = out_hash;
        bVar16 = hash_pnext_chain(recorder,&local_f0,pVVar13->pNext,&dynamic_info,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if (((uint)local_e0 >> 8 & 1) == 0) {
        local_f0.h = local_f0.h * 0x100000001b3;
      }
      else {
        pVVar15 = create_info->pTessellationState;
        if (dynamic_info.patch_control_points == false) {
          uVar21 = (ulong)pVVar15->patchControlPoints;
        }
        else {
          uVar21 = 0;
        }
        local_f0.h = (local_f0.h * 0x100000001b3 ^ (ulong)pVVar15->flags) * 0x100000001b3 ^ uVar21;
        bVar16 = hash_pnext_chain(recorder,&local_f0,pVVar15->pNext,&dynamic_info,state_flags);
        if (!bVar16) {
          return false;
        }
      }
      if ((uVar27 >> 0x10 & 1) != 0) {
        uVar21 = 0xffffffffffffffff;
        lVar26 = 0;
        while (uVar21 = uVar21 + 1, uVar21 < create_info->stageCount) {
          bVar16 = compute_hash_stage(recorder,&local_f0,
                                      (VkPipelineShaderStageCreateInfo *)
                                      ((long)&create_info->pStages->sType + lVar26));
          lVar26 = lVar26 + 0x30;
          state_flags = local_88;
          if (!bVar16) {
            return false;
          }
        }
      }
      bVar16 = hash_pnext_chain(recorder,&local_f0,create_info->pNext,&dynamic_info,state_flags);
      if (bVar16) {
        *out_hash = local_f0.h;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool compute_hash_graphics_pipeline(const StateRecorder &recorder, const VkGraphicsPipelineCreateInfo &create_info, Hash *out_hash)
{
	// Ignore pipelines that cannot result in meaningful replay.
	auto state_flags = graphics_pipeline_get_effective_state_flags(create_info);

	Hasher h;
	Hash hash;

	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, create_info.pNext))
		h.u32(0);
	else
		h.u32(normalize_pipeline_creation_flags(create_info.flags));

	if ((create_info.flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
	    create_info.basePipelineHandle != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_graphics_pipeline_handle(create_info.basePipelineHandle, &hash))
			return false;
		h.u64(hash);
		h.s32(create_info.basePipelineIndex);
	}

	DynamicStateInfo dynamic_info = {};
	if (create_info.pDynamicState)
		dynamic_info = parse_dynamic_state_info(*create_info.pDynamicState);
	GlobalStateInfo global_info = parse_global_state_info(create_info, dynamic_info, { true, true });

	if (global_info.layout_state)
	{
		if (!recorder.get_hash_for_pipeline_layout(create_info.layout, &hash))
			return false;
	}
	else
		hash = 0;

	h.u64(hash);

	// Need to query state info in two stages. Do we ignore render pass? If so, query a 0 hash.
	// If we don't ignore render pass, we can query for subpass meta.
	hash = 0;
	if (global_info.render_pass_state && !recorder.get_hash_for_render_pass(create_info.renderPass, &hash))
		return false;
	h.u64(hash);

	StateRecorder::SubpassMeta meta = {};
	if (!recorder.get_subpass_meta_for_pipeline(create_info, hash, &meta))
		return false;

	global_info = parse_global_state_info(create_info, dynamic_info, meta);

	h.u32(global_info.render_pass_state ? create_info.subpass : 0u);
	h.u32(global_info.module_state ? create_info.stageCount : 0u);

	if (create_info.pDynamicState)
	{
		auto &state = *create_info.pDynamicState;
		h.u32(state.dynamicStateCount);
		h.u32(state.flags);
		for (uint32_t i = 0; i < state.dynamicStateCount; i++)
			h.u32(state.pDynamicStates[i]);
		if (!hash_pnext_chain(&recorder, h, state.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.depth_stencil_state)
	{
		auto &ds = *create_info.pDepthStencilState;
		h.u32(ds.flags);
		h.u32(dynamic_info.depth_bounds_test_enable ? 0 : ds.depthBoundsTestEnable);
		h.u32(dynamic_info.depth_compare_op ? 0 : ds.depthCompareOp);
		h.u32(dynamic_info.depth_test_enable ? 0 : ds.depthTestEnable);
		h.u32(dynamic_info.depth_write_enable ? 0 : ds.depthWriteEnable);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.compareOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.depthFailOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.failOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.front.passOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.compareOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.depthFailOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.failOp);
		h.u32(dynamic_info.stencil_op ? 0 : ds.back.passOp);
		h.u32(dynamic_info.stencil_test_enable ? 0 : ds.stencilTestEnable);

		if (!dynamic_info.depth_bounds && (ds.depthBoundsTestEnable || dynamic_info.depth_bounds_test_enable))
		{
			h.f32(ds.minDepthBounds);
			h.f32(ds.maxDepthBounds);
		}

		if (ds.stencilTestEnable || dynamic_info.stencil_test_enable)
		{
			if (!dynamic_info.stencil_compare)
			{
				h.u32(ds.front.compareMask);
				h.u32(ds.back.compareMask);
			}

			if (!dynamic_info.stencil_reference)
			{
				h.u32(ds.front.reference);
				h.u32(ds.back.reference);
			}

			if (!dynamic_info.stencil_write_mask)
			{
				h.u32(ds.front.writeMask);
				h.u32(ds.back.writeMask);
			}
		}

		if (!hash_pnext_chain(&recorder, h, ds.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.input_assembly)
	{
		auto &ia = *create_info.pInputAssemblyState;
		h.u32(ia.flags);
		h.u32(dynamic_info.primitive_restart_enable ? 0 : ia.primitiveRestartEnable);
		// Dynamic 3 makes this fully ignored, but it depends on a property. For sanity's sake we need to hash this.
		h.u32(ia.topology);

		if (!hash_pnext_chain(&recorder, h, ia.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.rasterization_state)
	{
		auto &rs = *create_info.pRasterizationState;
		h.u32(rs.flags);
		h.u32(dynamic_info.cull_mode ? 0 : rs.cullMode);
		h.u32(dynamic_info.depth_clamp_enable ? 0 : rs.depthClampEnable);
		h.u32(dynamic_info.front_face ? 0 : rs.frontFace);
		h.u32(dynamic_info.rasterizer_discard_enable ? 0 : rs.rasterizerDiscardEnable);
		h.u32(dynamic_info.polygon_mode ? 0 : rs.polygonMode);
		h.u32(dynamic_info.depth_bias_enable ? 0 : rs.depthBiasEnable);

		if ((rs.depthBiasEnable || dynamic_info.depth_bias_enable) && !dynamic_info.depth_bias)
		{
			h.f32(rs.depthBiasClamp);
			h.f32(rs.depthBiasSlopeFactor);
			h.f32(rs.depthBiasConstantFactor);
		}

		if (!dynamic_info.line_width)
			h.f32(rs.lineWidth);

		if (!hash_pnext_chain(&recorder, h, rs.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.multisample_state)
	{
		auto &ms = *create_info.pMultisampleState;
		h.u32(ms.flags);
		h.u32(dynamic_info.alpha_to_coverage_enable ? 0 : ms.alphaToCoverageEnable);
		h.u32(dynamic_info.alpha_to_one_enable ? 0 : ms.alphaToOneEnable);
		h.f32(ms.minSampleShading);
		h.u32(dynamic_info.rasterization_samples ? 0 : ms.rasterizationSamples);
		h.u32(ms.sampleShadingEnable);
		if (!dynamic_info.sample_mask && ms.pSampleMask)
		{
			uint32_t elems = (ms.rasterizationSamples + 31) / 32;
			for (uint32_t i = 0; i < elems; i++)
				h.u32(ms.pSampleMask[i]);
		}
		else
			h.u32(0);

		if (!hash_pnext_chain(&recorder, h, ms.pNext, &dynamic_info, state_flags))
			return false;
	}

	if (global_info.viewport_state)
	{
		auto &vp = *create_info.pViewportState;
		h.u32(vp.flags);
		h.u32(dynamic_info.scissor_count ? 0 : vp.scissorCount);
		h.u32(dynamic_info.viewport_count ? 0 : vp.viewportCount);

		if (!dynamic_info.scissor)
		{
			for (uint32_t i = 0; i < vp.scissorCount; i++)
			{
				h.s32(vp.pScissors[i].offset.x);
				h.s32(vp.pScissors[i].offset.y);
				h.u32(vp.pScissors[i].extent.width);
				h.u32(vp.pScissors[i].extent.height);
			}
		}

		if (!dynamic_info.viewport)
		{
			for (uint32_t i = 0; i < vp.viewportCount; i++)
			{
				h.f32(vp.pViewports[i].x);
				h.f32(vp.pViewports[i].y);
				h.f32(vp.pViewports[i].width);
				h.f32(vp.pViewports[i].height);
				h.f32(vp.pViewports[i].minDepth);
				h.f32(vp.pViewports[i].maxDepth);
			}
		}

		if (!hash_pnext_chain(&recorder, h, vp.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.vertex_input)
	{
		auto &vi = *create_info.pVertexInputState;
		h.u32(vi.flags);
		h.u32(vi.vertexAttributeDescriptionCount);
		h.u32(vi.vertexBindingDescriptionCount);

		for (uint32_t i = 0; i < vi.vertexAttributeDescriptionCount; i++)
		{
			h.u32(vi.pVertexAttributeDescriptions[i].offset);
			h.u32(vi.pVertexAttributeDescriptions[i].binding);
			h.u32(vi.pVertexAttributeDescriptions[i].format);
			h.u32(vi.pVertexAttributeDescriptions[i].location);
		}

		for (uint32_t i = 0; i < vi.vertexBindingDescriptionCount; i++)
		{
			h.u32(vi.pVertexBindingDescriptions[i].binding);
			h.u32(vi.pVertexBindingDescriptions[i].inputRate);
			h.u32(dynamic_info.vertex_input_binding_stride ? 0 : vi.pVertexBindingDescriptions[i].stride);
		}

		if (!hash_pnext_chain(&recorder, h, vi.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.color_blend_state)
	{
		auto &b = *create_info.pColorBlendState;
		h.u32(b.flags);
		h.u32(b.attachmentCount);
		h.u32(dynamic_info.logic_op_enable ? 0 : b.logicOpEnable);
		h.u32(dynamic_info.logic_op || (!b.logicOpEnable && !dynamic_info.logic_op_enable) ? 0 : b.logicOp);

		bool need_blend_constants = false;

		// Special EDS3 rule. If all of these are set, we must ignore the pAttachments pointer.
		const bool dynamic_attachments = dynamic_info.color_blend_enable &&
		                                 dynamic_info.color_write_mask &&
		                                 dynamic_info.color_blend_equation;

		// If we have dynamic equation, but not dynamic blend constants, we can dynamically set blend constant
		// as input, so we might need to know those constants to hash the PSO.
		if (dynamic_info.color_blend_equation)
			need_blend_constants = true;

		if (dynamic_attachments)
			h.u32(0);

		for (uint32_t i = 0; !dynamic_attachments && i < b.attachmentCount; i++)
		{
			h.u32(dynamic_info.color_blend_enable ? 0 : b.pAttachments[i].blendEnable);
			h.u32(dynamic_info.color_write_mask ? 0 : b.pAttachments[i].colorWriteMask);
			if (b.pAttachments[i].blendEnable || dynamic_info.color_blend_enable)
			{
				if (!dynamic_info.color_blend_equation)
				{
					h.u32(dynamic_info.color_blend_advanced ? 0 : b.pAttachments[i].alphaBlendOp);
					h.u32(dynamic_info.color_blend_advanced ? 0 : b.pAttachments[i].colorBlendOp);
					h.u32(b.pAttachments[i].dstAlphaBlendFactor);
					h.u32(b.pAttachments[i].srcAlphaBlendFactor);
					h.u32(b.pAttachments[i].dstColorBlendFactor);
					h.u32(b.pAttachments[i].srcColorBlendFactor);
				}
				else
					h.u32(0);

				if (b.pAttachments[i].dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				    b.pAttachments[i].srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				    b.pAttachments[i].dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				    b.pAttachments[i].srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				    b.pAttachments[i].srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR)
				{
					need_blend_constants = true;
				}
			}
			else
				h.u32(0);
		}

		if (need_blend_constants && !dynamic_info.blend_constants)
			for (auto &blend_const : b.blendConstants)
				h.f32(blend_const);

		if (!hash_pnext_chain(&recorder, h, b.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.tessellation_state)
	{
		auto &tess = *create_info.pTessellationState;
		h.u32(tess.flags);
		h.u32(dynamic_info.patch_control_points ? 0 : tess.patchControlPoints);

		if (!hash_pnext_chain(&recorder, h, tess.pNext, &dynamic_info, state_flags))
			return false;
	}
	else
		h.u32(0);

	if (global_info.module_state)
	{
		for (uint32_t i = 0; i < create_info.stageCount; i++)
		{
			auto &stage = create_info.pStages[i];
			if (!compute_hash_stage(recorder, h, stage))
				return false;
		}
	}

	if (!hash_pnext_chain(&recorder, h, create_info.pNext, &dynamic_info, state_flags))
		return false;

	*out_hash = h.get();
	return true;
}